

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_rbegin_rend_Test::TestBody(string_view_rbegin_rend_Test *this)

{
  bool bVar1;
  reference rhs;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  const_reverse_iterator end;
  const_reverse_iterator iter;
  undefined1 local_20 [7];
  char count;
  string_view sv;
  string_view_rbegin_rend_Test *this_local;
  
  sv.size_ = (size_type)this;
  wabt::string_view::string_view((string_view *)local_20,"012345");
  iter.current._7_1_ = '\0';
  wabt::string_view::rbegin((string_view *)&end);
  wabt::string_view::rend((string_view *)&gtest_ar.message_);
  while( true ) {
    bVar1 = std::operator!=(&end,(reverse_iterator<const_char_*> *)&gtest_ar.message_);
    if (!bVar1) {
      local_7c = 6;
      testing::internal::EqHelper<false>::Compare<int,char>
                ((EqHelper<false> *)local_78,"6","count",&local_7c,(char *)((long)&iter.current + 7)
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
      if (!bVar1) {
        testing::Message::Message(&local_88);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                   ,0x6c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        testing::Message::~Message(&local_88);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
      return;
    }
    local_4c = 0x35 - iter.current._7_1_;
    rhs = std::reverse_iterator<const_char_*>::operator*(&end);
    testing::internal::EqHelper<false>::Compare<int,char>
              ((EqHelper<false> *)local_48,"\'5\' - count","*iter",&local_4c,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(&local_58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x69,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::Message::~Message(&local_58);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    iter.current._7_1_ = iter.current._7_1_ + '\x01';
    std::reverse_iterator<const_char_*>::operator++(&end);
  }
  return;
}

Assistant:

TEST(string_view, rbegin_rend) {
  string_view sv("012345");

  char count = 0;
  for (auto iter = sv.rbegin(), end = sv.rend(); iter != end; ++iter) {
    ASSERT_EQ('5' - count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}